

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O2

undefined4 __thiscall
despot::RockSampleENTScenarioLowerBound::Value
          (RockSampleENTScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  uint uVar1;
  pointer ppSVar2;
  State *state;
  int iVar3;
  ulong uVar4;
  int i;
  ulong uVar5;
  int iVar6;
  int rock;
  ulong uVar7;
  int iVar8;
  double dVar9;
  Coord rob_pos;
  int iStack_7c;
  Coord rock_pos;
  int iStack_74;
  double local_70;
  double local_68;
  double local_60;
  vector<double,_std::allocator<double>_> expected_sampling_value;
  undefined4 local_40 [4];
  
  std::vector<double,_std::allocator<double>_>::vector
            (&expected_sampling_value,(long)this->rs_model_->num_rocks_,(allocator_type *)&rob_pos);
  despot::Coord::Coord(&rob_pos);
  local_60 = 0.0;
  for (uVar5 = 0;
      ppSVar2 = (particles->super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                _M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(particles->
                            super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppSVar2 >> 3);
      uVar5 = uVar5 + 1) {
    state = ppSVar2[uVar5];
    _rob_pos = BaseRockSample::GetRobPos(this->rs_model_,state);
    dVar9 = *(double *)(state + 0x18);
    uVar1 = this->rs_model_->num_rocks_;
    uVar7 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar7 = 0;
    }
    for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
      expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] =
           *(double *)(state + 0x18) *
           *(double *)
            (&DAT_00117060 + (ulong)((*(uint *)(state + 0xc) >> ((uint)uVar4 & 0x1f) & 1) == 0) * 8)
           + expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar4];
    }
    local_60 = local_60 + dVar9;
  }
  local_70 = 1.0;
  local_68 = 0.0;
  iVar8 = -1;
  while( true ) {
    iVar3 = this->grid_->xsize_;
    iVar6 = this->grid_->ysize_;
    despot::Coord::Coord(&rock_pos,-1,-1);
    iVar6 = iVar6 + iVar3;
    uVar7 = 0;
    uVar5 = 0xffffffff;
    while( true ) {
      if ((long)this->rs_model_->num_rocks_ <= (long)uVar7) break;
      iVar3 = despot::Coord::ManhattanDistance
                        (_rob_pos,*(undefined8 *)
                                   ((this->rs_model_->rock_pos_).
                                    super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>
                                    ._M_impl.super__Vector_impl_data._M_start + uVar7 * 8));
      if ((0.1 < expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>._M_impl
                 .super__Vector_impl_data._M_start[uVar7]) && (iVar3 < iVar6)) {
        _rock_pos = *(undefined8 *)
                     ((this->rs_model_->rock_pos_).
                      super__Vector_base<despot::Coord,_std::allocator<despot::Coord>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar7 * 8);
        uVar5 = uVar7 & 0xffffffff;
        iVar6 = iVar3;
      }
      uVar7 = uVar7 + 1;
    }
    iVar3 = (int)uVar5;
    if (iVar3 == -1) break;
    if (iVar8 == -1) {
      iVar8 = 3;
      if (_rob_pos <= _rock_pos) {
        iVar8 = 1;
        if (_rock_pos <= _rob_pos) {
          iVar8 = 2;
          if (iStack_7c <= iStack_74) {
            iVar8 = (uint)(iStack_74 <= iStack_7c) << 2;
          }
        }
      }
    }
    iVar6 = despot::Coord::ManhattanDistance(_rock_pos,_rob_pos);
    dVar9 = pow(_ParticleBelief,(double)iVar6);
    local_70 = local_70 * dVar9;
    local_68 = local_68 +
               expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[iVar3] * local_70;
    expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[iVar3] = -1.0;
    _rob_pos = _rock_pos;
  }
  dVar9 = pow(_ParticleBelief,(double)(this->grid_->xsize_ - _rob_pos));
  iVar3 = 1;
  if (iVar8 != -1) {
    iVar3 = iVar8;
  }
  despot::ValuedAction::ValuedAction
            ((ValuedAction *)local_40,iVar3,dVar9 * local_60 * 10.0 * local_70 + local_68);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&expected_sampling_value.super__Vector_base<double,_std::allocator<double>_>);
  return local_40[0];
}

Assistant:

ValuedAction Value(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		vector<double> expected_sampling_value = vector<double>(
			rs_model_->num_rocks_);
		Coord rob_pos;
		double weight = 0;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			rob_pos = rs_model_->GetRobPos(particle);
			weight += particle->weight;
			for (int i = 0; i < rs_model_->num_rocks_; i++) {
				expected_sampling_value[i] += particle->weight
					* (rs_model_->GetRock(particle, i) ? 10 : -10);
			}
		}

		ACT_TYPE action = -1;
		double value = 0;
		double discount = 1.0;
		while (true) {
			// Move to the nearest valuable rock and sample
			int shortest = grid_.xsize() + grid_.ysize();
			int id = -1;
			Coord rock_pos(-1, -1);
			for (int rock = 0; rock < rs_model_->num_rocks_; rock++) {
				int dist = Coord::ManhattanDistance(rob_pos,
					rs_model_->rock_pos_[rock]);
				if (expected_sampling_value[rock] > 0.1 && dist < shortest) {
					shortest = dist;
					id = rock;
					rock_pos = rs_model_->rock_pos_[rock];
				}
			}
			/*
			 // Move to the most valuable rock and sample
			 int best = 0;
			 int id = -1;
			 Coord rock_pos(-1, -1);
			 for (int rock=0; rock<rs_model_->num_rocks_; rock++) {
			 double v = expected_sampling_value[rock] * Globals::Discount(Coord::ManhattanDistance(rob_pos, rs_model_->rock_pos_[rock]));
			 if (v > best) {
			 best = v;
			 id = rock;
			 rock_pos = rs_model_->rock_pos_[rock];
			 }
			 }
			 */

			if (id == -1)
				break;

			if (action == -1) {
				if (rock_pos.x < rob_pos.x)
					action = Compass::WEST;
				else if (rock_pos.x > rob_pos.x)
					action = Compass::EAST;
				else if (rock_pos.y < rob_pos.y)
					action = Compass::SOUTH;
				else if (rock_pos.y > rob_pos.y)
					action = Compass::NORTH;
				else
					action = rs_model_->E_SAMPLE;
			}

			discount *= Globals::Discount(Coord::ManhattanDistance(rock_pos, rob_pos));
			value += discount * expected_sampling_value[id];
			expected_sampling_value[id] = -1; // set to bad rock
			rob_pos = rock_pos;
		}

		if (action == -1)
			action = Compass::EAST;

		value += 10 * weight * discount * Globals::Discount(grid_.xsize() - rob_pos.x);

		return ValuedAction(action, value);
	}